

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O0

int SoapySDRDevice_writeGPIO(SoapySDRDevice *device,char *bank,uint value)

{
  undefined4 in_EDX;
  char *in_RSI;
  long *in_RDI;
  exception *ex;
  allocator local_41;
  string local_40 [36];
  undefined4 local_1c;
  char *local_18;
  long *local_10;
  
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  SoapySDRDevice_clearError();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,local_18,&local_41);
  (**(code **)(*local_10 + 0x368))(local_10,local_40,local_1c);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return 0;
}

Assistant:

int SoapySDRDevice_writeGPIO(SoapySDRDevice *device, const char *bank, const unsigned value)
{
    __SOAPY_SDR_C_TRY
    device->writeGPIO(bank, value);
    __SOAPY_SDR_C_CATCH
}